

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O3

int __thiscall QFbScreen::raise(QFbScreen *this,int __sig)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QWindow *pQVar4;
  long lVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  long in_FS_OFFSET;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,__sig);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x30) != 0) {
    lVar5 = -8;
    do {
      if (*(long *)(this + 0x30) * -8 + lVar5 == -8) goto LAB_0011cb3f;
      lVar1 = lVar5 + 8;
      plVar2 = (long *)(*(long *)(this + 0x28) + 8 + lVar5);
      lVar5 = lVar1;
    } while ((long *)*plVar2 != plVar7);
    uVar6 = (uint)(lVar1 >> 3);
    if (0 < (int)uVar6) {
      QList<QFbWindow_*>::move((QList<QFbWindow_*> *)(this + 0x20),(ulong)(uVar6 & 0x7fffffff),0);
      (**(code **)(*plVar7 + 0x30))(plVar7);
      (**(code **)(*(long *)this + 0xd0))(this);
      pQVar4 = topWindow(this);
      QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
                (pQVar4,7);
      (**(code **)(*(long *)this + 0xb8))(this,pQVar4);
    }
  }
LAB_0011cb3f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFbScreen::raise(QFbWindow *window)
{
    int index = mWindowStack.indexOf(window);
    if (index <= 0)
        return;
    mWindowStack.move(index, 0);
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}